

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::glslAssignBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  string *psVar1;
  int iVar2;
  char *__rhs;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  int iVar4;
  allocator<char> local_c1;
  string *local_c0;
  DataType local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string indentation;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
  std::__cxx11::string::_M_construct((ulong)&indentation,(char)indentationDepth);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c0 = __return_storage_ptr__;
  std::operator+(&local_90,&indentation,name);
  std::operator+(&local_b0,&local_90," = ");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  uVar3 = extraout_RDX;
  if (type != TYPE_FLOAT) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    __rhs = glu::getDataTypeName(type);
    std::operator+(&local_90,&local_70,__rhs);
    std::operator+(&local_b0,&local_90,"(");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    uVar3 = extraout_RDX_00;
  }
  iVar4 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  local_b4 = type;
  for (; psVar1 = local_c0, iVar2 != iVar4; iVar4 = iVar4 + 1) {
    if (iVar4 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"v",&local_c1);
    }
    else {
      de::floatToString_abi_cxx11_(&local_90,(de *)&DAT_00000001,(float)iVar4 * 0.8,(int)uVar3);
      std::operator+(&local_b0,", v+",&local_90);
    }
    std::__cxx11::string::append((string *)local_c0);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar3 = extraout_RDX_01;
    if (iVar4 != 0) {
      std::__cxx11::string::~string((string *)&local_90);
      uVar3 = extraout_RDX_02;
    }
  }
  if (local_b4 != TYPE_FLOAT) {
    std::__cxx11::string::append((char *)local_c0);
  }
  std::operator+(&local_70,";\n",&indentation);
  std::operator+(&local_b0,&local_70,"v += 0.4;\n");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&indentation);
  return psVar1;
}

Assistant:

string UserDefinedIOCase::glslAssignBasicTypeObject (const string& name, glu::DataType type, int indentationDepth)
{
	const int		scalarSize		= glu::getDataTypeScalarSize(type);
	const string	indentation		= string(indentationDepth, '\t');
	string			result;

	result += indentation + name + " = ";

	if (type != glu::TYPE_FLOAT)
		result += string() + glu::getDataTypeName(type) + "(";
	for (int i = 0; i < scalarSize; i++)
		result += (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1)
						 : "v");
	if (type != glu::TYPE_FLOAT)
		result += ")";
	result += ";\n" +
			  indentation + "v += 0.4;\n";
	return result;
}